

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampFormatCase::TextureBorderClampFormatCase
          (TextureBorderClampFormatCase *this,Context *context,char *name,char *description,
          deUint32 texFormat,DepthStencilMode mode,StateType stateType,SizeType sizeType,
          deUint32 filter,SamplingFunction samplingFunction)

{
  bool bVar1;
  int texHeight;
  int texWidth;
  tcu local_5c [8];
  IVec3 blockPixelSize;
  CompressedTexFormat compressedFormat;
  DepthStencilMode mode_local;
  deUint32 texFormat_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  TextureBorderClampFormatCase *this_local;
  
  texWidth = 0x11;
  if (sizeType == SIZE_POT) {
    texWidth = 0x20;
  }
  texHeight = 0x1f;
  if (sizeType == SIZE_POT) {
    texHeight = 0x10;
  }
  TextureBorderClampTest::TextureBorderClampTest
            (&this->super_TextureBorderClampTest,context,name,description,texFormat,mode,stateType,
             texWidth,texHeight,samplingFunction,0);
  (this->super_TextureBorderClampTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBorderClampFormatCase_032c67f8;
  this->m_sizeType = sizeType;
  this->m_filter = filter;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::vector(&this->m_iterations);
  bVar1 = glu::isCompressedFormat(texFormat);
  if (bVar1) {
    blockPixelSize.m_data[1] = glu::mapGLCompressedTexFormat(texFormat);
    tcu::getBlockPixelSize(local_5c,blockPixelSize.m_data[1]);
  }
  return;
}

Assistant:

TextureBorderClampFormatCase::TextureBorderClampFormatCase	(Context&						context,
															 const char*					name,
															 const char*					description,
															 deUint32						texFormat,
															 tcu::Sampler::DepthStencilMode	mode,
															 StateType						stateType,
															 SizeType						sizeType,
															 deUint32						filter,
															 SamplingFunction				samplingFunction)
	: TextureBorderClampTest(context,
							 name,
							 description,
							 texFormat,
							 mode,
							 stateType,
							 (sizeType == SIZE_POT) ? (32) : (17),
							 (sizeType == SIZE_POT) ? (16) : (31),
							 samplingFunction)
	, m_sizeType			(sizeType)
	, m_filter				(filter)
{
	if (m_sizeType == SIZE_POT)
		DE_ASSERT(deIsPowerOfTwo32(m_texWidth) && deIsPowerOfTwo32(m_texHeight));
	else
		DE_ASSERT(!deIsPowerOfTwo32(m_texWidth) && !deIsPowerOfTwo32(m_texHeight));

	if (glu::isCompressedFormat(texFormat))
	{
		const tcu::CompressedTexFormat	compressedFormat	= glu::mapGLCompressedTexFormat(texFormat);
		const tcu::IVec3				blockPixelSize		= tcu::getBlockPixelSize(compressedFormat);

		// is (not) multiple of a block size
		if (m_sizeType == SIZE_POT)
			DE_ASSERT((m_texWidth % blockPixelSize.x()) == 0 && (m_texHeight % blockPixelSize.y()) == 0);
		else
			DE_ASSERT((m_texWidth % blockPixelSize.x()) != 0 && (m_texHeight % blockPixelSize.y()) != 0);

		DE_UNREF(blockPixelSize);
	}
}